

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ConditionalStatementSyntax *syntax)

{
  SyntaxKind SVar1;
  ConditionalPredicateSyntax *pCVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  SyntaxNode *this;
  BlockStatementSyntax *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  ConditionalStatementSyntax *pCVar4;
  StatementBlockSymbol *pSVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  StatementBlockSymbol *member;
  StatementBlockSymbol *pSVar7;
  long lVar8;
  ulong uVar9;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar10;
  VariableLifetime local_80;
  StatementBlockKind local_7c;
  StatementBlockSymbol *local_78;
  Scope *local_70;
  Compilation *local_68;
  SourceLocation local_60;
  ConditionalStatementSyntax *local_58;
  Token local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_68 = scope->compilation;
  pCVar2 = (syntax->predicate).ptr;
  uVar9 = (pCVar2->conditions).elements._M_extent._M_extent_value + 1;
  local_70 = scope;
  local_58 = syntax;
  if (uVar9 < 2) {
    member = (StatementBlockSymbol *)0x0;
    local_78 = (StatementBlockSymbol *)0x0;
  }
  else {
    uVar9 = uVar9 >> 1;
    lVar8 = 0;
    local_78 = (StatementBlockSymbol *)0x0;
    pSVar7 = (StatementBlockSymbol *)0x0;
    do {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((pCVar2->conditions).elements._M_ptr)->super_ConstTokenOrSyntax
                                   ).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      pSVar3 = *ppSVar6;
      this = pSVar3[1].parent;
      member = pSVar7;
      pSVar5 = local_78;
      if (this != (SyntaxNode *)0x0) {
        local_40._M_len = 0;
        local_40._M_str = "";
        local_50 = slang::syntax::SyntaxNode::getFirstToken(this);
        local_60 = parsing::Token::location(&local_50);
        local_7c = Sequential;
        local_80 = Automatic;
        member = BumpAllocator::
                 emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                           (&local_68->super_BumpAllocator,local_68,&local_40,&local_60,&local_7c,
                            &local_80);
        Scope::getOrAddDeferredData(&member->super_Scope);
        (member->super_Symbol).originatingSyntax = pSVar3;
        pSVar5 = member;
        if (local_78 != (StatementBlockSymbol *)0x0) {
          Scope::insertMember(&pSVar7->super_Scope,&member->super_Symbol,
                              (pSVar7->super_Scope).lastMember,false,true);
          pSVar5 = local_78;
        }
      }
      local_78 = pSVar5;
      lVar8 = lVar8 + 0x30;
      uVar9 = uVar9 - 1;
      pSVar7 = member;
    } while (uVar9 != 0);
  }
  pCVar4 = local_58;
  syntax_00 = (BlockStatementSyntax *)(local_58->statement).ptr;
  SVar1 = (syntax_00->super_StatementSyntax).super_SyntaxNode.kind;
  if ((SVar1 == ParallelBlockStatement) || (SVar1 == SequentialBlockStatement)) {
    pSVar7 = fromSyntax(local_70,syntax_00);
  }
  else {
    local_40._M_len = 0;
    local_40._M_str = "";
    local_50 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax_00);
    local_60 = parsing::Token::location(&local_50);
    local_7c = Sequential;
    local_80 = Automatic;
    pSVar7 = BumpAllocator::
             emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                       (&local_68->super_BumpAllocator,local_68,&local_40,&local_60,&local_7c,
                        &local_80);
    (pSVar7->super_Symbol).originatingSyntax = &((pCVar4->statement).ptr)->super_SyntaxNode;
    syntax_01._M_ptr =
         (pCVar4->super_StatementSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_01._M_extent._M_extent_value =
         (pCVar4->super_StatementSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&pSVar7->super_Symbol,local_70,syntax_01);
    sVar10 = Statement::createAndAddBlockItems(&pSVar7->super_Scope,(pCVar4->statement).ptr,false);
    pSVar7->blocks = sVar10;
  }
  Scope::insertMember(&member->super_Scope,&pSVar7->super_Symbol,(member->super_Scope).lastMember,
                      false,true);
  return local_78;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ConditionalStatementSyntax& syntax) {
    // Each matches clause gets its own block with its own variables.
    auto& comp = scope.getCompilation();
    StatementBlockSymbol* first = nullptr;
    StatementBlockSymbol* curr = nullptr;

    for (auto cond : syntax.predicate->conditions) {
        if (cond->matchesClause) {
            auto block = comp.emplace<StatementBlockSymbol>(
                comp, ""sv, cond->matchesClause->getFirstToken().location(),
                StatementBlockKind::Sequential, VariableLifetime::Automatic);

            // Each block needs elaboration to collect pattern variables.
            block->setNeedElaboration();
            block->setSyntax(*cond);

            if (!first) {
                first = curr = block;
            }
            else {
                curr->addMember(*block);
                curr = block;
            }
        }
    }

    // The most nested block gets the actual statement items. If it's already a sequential
    // block we can just use that, otherwise we need to fabricate one.
    StatementBlockSymbol* block;
    if (syntax.statement->kind == SyntaxKind::SequentialBlockStatement ||
        syntax.statement->kind == SyntaxKind::ParallelBlockStatement) {

        block = &StatementBlockSymbol::fromSyntax(scope,
                                                  syntax.statement->as<BlockStatementSyntax>());
    }
    else {
        block = comp.emplace<StatementBlockSymbol>(comp, ""sv,
                                                   syntax.statement->getFirstToken().location(),
                                                   StatementBlockKind::Sequential,
                                                   VariableLifetime::Automatic);
        block->setSyntax(*syntax.statement);
        block->setAttributes(scope, syntax.attributes);
        block->blocks = Statement::createAndAddBlockItems(*block, *syntax.statement,
                                                          /* labelHandled */ false);
    }

    SLANG_ASSERT(curr && first);
    curr->addMember(*block);

    return *first;
}